

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_archive.cpp
# Opt level: O0

bool __thiscall ON_BinaryArchive::ReadArray(ON_BinaryArchive *this,ON_ClassArray<ON_ObjRef> *a)

{
  ON_ObjRef *this_00;
  bool local_31;
  bool local_21;
  int local_20;
  int iStack_1c;
  bool rc;
  int count;
  int i;
  ON_ClassArray<ON_ObjRef> *a_local;
  ON_BinaryArchive *this_local;
  
  _count = a;
  a_local = (ON_ClassArray<ON_ObjRef> *)this;
  ON_ClassArray<ON_ObjRef>::Empty(a);
  local_21 = ReadInt(this,&local_20);
  if (local_21) {
    ON_ClassArray<ON_ObjRef>::SetCapacity(_count,(long)local_20);
    iStack_1c = 0;
    while( true ) {
      local_31 = false;
      if (iStack_1c < local_20) {
        local_31 = local_21;
      }
      if (local_31 == false) break;
      this_00 = ON_ClassArray<ON_ObjRef>::AppendNew(_count);
      local_21 = ON_ObjRef::Read(this_00,this);
      iStack_1c = iStack_1c + 1;
    }
  }
  return local_21;
}

Assistant:

bool ON_BinaryArchive::ReadArray( ON_ClassArray<ON_ObjRef>& a)
{
  a.Empty();
  int i, count;
  bool rc = ReadInt( &count );
  if (rc)
  {
    a.SetCapacity(count);
    for  ( i = 0; i < count && rc; i++ )
    {
      rc = a.AppendNew().Read(*this);
    }
  }
  return rc;
}